

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdtd3D.c
# Opt level: O0

void update_magnetic_cpml(fdtd3D *fdtd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double *in_RDI;
  double dVar58;
  double dVar59;
  double dVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  uintmax_t k_5;
  uintmax_t j_5;
  uintmax_t i_5;
  uintmax_t k_4;
  uintmax_t j_4;
  uintmax_t i_4;
  uintmax_t k_3;
  uintmax_t j_3;
  uintmax_t i_3;
  uintmax_t k_2;
  uintmax_t j_2;
  uintmax_t i_2;
  uintmax_t k_1;
  uintmax_t j_1;
  uintmax_t i_1;
  uintmax_t k;
  uintmax_t j;
  uintmax_t i;
  float_type _dz;
  float_type _dy;
  float_type _dx;
  float_type_0__0_ *permeability_inv;
  float_type_0__0_ *ez;
  float_type_0__0_ *ey;
  float_type_0__0_ *ex;
  float_type_0__0_ *hz;
  float_type_0__0_ *hy;
  float_type_0__0_ *hx;
  float_type_0__0_ *psi_hz_right;
  float_type_0__0_ *psi_hz_left;
  float_type_0__0_ *psi_hz_top;
  float_type_0__0_ *psi_hz_bottom;
  float_type_0__0_ *psi_hy_back;
  float_type_0__0_ *psi_hy_front;
  float_type_0__0_ *psi_hy_top;
  float_type_0__0_ *psi_hy_bottom;
  float_type_0__0_ *psi_hx_back;
  float_type_0__0_ *psi_hx_front;
  float_type_0__0_ *psi_hx_right;
  float_type_0__0_ *psi_hx_left;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  
  dVar1 = in_RDI[0x2a];
  dVar2 = in_RDI[0x33];
  dVar3 = in_RDI[0xc];
  dVar4 = in_RDI[0x2a];
  dVar5 = in_RDI[0x33];
  dVar6 = in_RDI[0xd];
  dVar7 = in_RDI[0x32];
  dVar8 = in_RDI[0x2a];
  dVar9 = in_RDI[0xe];
  dVar10 = in_RDI[0x32];
  dVar11 = in_RDI[0x2a];
  dVar12 = in_RDI[0xf];
  dVar13 = in_RDI[0x32];
  dVar14 = in_RDI[0x33];
  dVar15 = in_RDI[0x10];
  dVar16 = in_RDI[0x32];
  dVar17 = in_RDI[0x33];
  dVar18 = in_RDI[0x11];
  dVar19 = in_RDI[0x32];
  dVar20 = in_RDI[0x2a];
  dVar21 = in_RDI[0x12];
  dVar22 = in_RDI[0x32];
  dVar23 = in_RDI[0x2a];
  dVar24 = in_RDI[0x13];
  dVar25 = in_RDI[0x32];
  dVar26 = in_RDI[0x33];
  dVar27 = in_RDI[0x14];
  dVar28 = in_RDI[0x32];
  dVar29 = in_RDI[0x33];
  dVar30 = in_RDI[0x15];
  dVar31 = in_RDI[0x2a];
  dVar32 = in_RDI[0x33];
  dVar33 = in_RDI[0x16];
  dVar34 = in_RDI[0x2a];
  dVar35 = in_RDI[0x33];
  dVar36 = in_RDI[0x17];
  dVar37 = in_RDI[0x32];
  dVar38 = in_RDI[0x33];
  dVar39 = in_RDI[4];
  dVar40 = in_RDI[0x32];
  dVar41 = in_RDI[0x33];
  dVar42 = in_RDI[5];
  dVar43 = in_RDI[0x32];
  dVar44 = in_RDI[0x33];
  dVar45 = in_RDI[6];
  dVar46 = in_RDI[0x32];
  dVar47 = in_RDI[0x33];
  dVar48 = in_RDI[7];
  dVar49 = in_RDI[0x32];
  dVar50 = in_RDI[0x33];
  dVar51 = in_RDI[8];
  dVar52 = in_RDI[0x32];
  dVar53 = in_RDI[0x33];
  dVar54 = in_RDI[9];
  dVar55 = in_RDI[0x32];
  dVar56 = in_RDI[0x33];
  dVar57 = in_RDI[0xb];
  dVar58 = 1.0 / *in_RDI;
  dVar59 = 1.0 / in_RDI[1];
  dVar60 = 1.0 / in_RDI[2];
  if ((*(uint *)((long)in_RDI + 0x16c) & 4) != 0) {
    for (local_f0 = 0.0; (ulong)local_f0 < (ulong)in_RDI[0x31];
        local_f0 = (double)((long)local_f0 + 1)) {
      for (local_f8 = 0.0; (ulong)local_f8 < (ulong)in_RDI[0x2a];
          local_f8 = (double)((long)local_f8 + 1)) {
        for (local_100 = 0.0; (ulong)local_100 < (ulong)in_RDI[0x33];
            local_100 = (double)((long)local_100 + 1)) {
          auVar85._8_8_ = 0;
          auVar85._0_8_ = *(ulong *)((long)in_RDI[0x25] + (long)local_f8 * 8);
          auVar61._8_8_ = 0;
          auVar61._0_8_ =
               *(ulong *)((long)dVar3 + (long)local_f0 * (long)dVar1 * (long)dVar2 * 8 +
                          (long)dVar2 * (long)local_f8 * 8 + (long)local_100 * 8);
          auVar109._8_8_ = 0;
          auVar109._0_8_ =
               *(double *)((long)in_RDI[0x28] + (long)local_f8 * 8) *
               (*(double *)
                 ((long)dVar54 + (long)local_f0 * (long)dVar52 * (long)dVar53 * 8 +
                  ((long)local_f8 + 1) * (long)dVar53 * 8 + (long)local_100 * 8) -
               *(double *)
                ((long)dVar54 + (long)local_f0 * (long)dVar52 * (long)dVar53 * 8 +
                 (long)dVar53 * (long)local_f8 * 8 + (long)local_100 * 8)) * dVar59;
          auVar61 = vfmadd213sd_fma(auVar61,auVar85,auVar109);
          *(long *)((long)dVar3 + (long)local_f0 * (long)dVar1 * (long)dVar2 * 8 +
                    (long)dVar2 * (long)local_f8 * 8 + (long)local_100 * 8) = auVar61._0_8_;
          auVar110._8_8_ = 0;
          auVar110._0_8_ =
               *(ulong *)((long)dVar39 + (long)local_f0 * (long)dVar37 * (long)dVar38 * 8 +
                          (long)dVar38 * (long)local_f8 * 8 + (long)local_100 * 8);
          auVar62._8_8_ = 0;
          auVar62._0_8_ =
               *(ulong *)((long)dVar3 + (long)local_f0 * (long)dVar1 * (long)dVar2 * 8 +
                          (long)dVar2 * (long)local_f8 * 8 + (long)local_100 * 8);
          auVar86._8_8_ = 0;
          auVar86._0_8_ =
               -(in_RDI[3] *
                *(double *)
                 ((long)dVar57 + (long)local_f0 * (long)dVar55 * (long)dVar56 * 8 +
                  (long)dVar56 * (long)local_f8 * 8 + (long)local_100 * 8));
          auVar61 = vfmadd213sd_fma(auVar62,auVar86,auVar110);
          *(long *)((long)dVar39 + (long)local_f0 * (long)dVar37 * (long)dVar38 * 8 +
                    (long)dVar38 * (long)local_f8 * 8 + (long)local_100 * 8) = auVar61._0_8_;
          auVar87._8_8_ = 0;
          auVar87._0_8_ = *(ulong *)((long)in_RDI[0x25] + (long)local_f8 * 8);
          auVar63._8_8_ = 0;
          auVar63._0_8_ =
               *(ulong *)((long)dVar33 + (long)local_f0 * (long)dVar31 * (long)dVar32 * 8 +
                          (long)dVar32 * (long)local_f8 * 8 + (long)local_100 * 8);
          auVar111._8_8_ = 0;
          auVar111._0_8_ =
               *(double *)((long)in_RDI[0x28] + (long)local_f8 * 8) *
               (*(double *)
                 ((long)dVar48 + (long)local_f0 * (long)dVar46 * (long)dVar47 * 8 +
                  ((long)local_f8 + 1) * (long)dVar47 * 8 + (long)local_100 * 8) -
               *(double *)
                ((long)dVar48 + (long)local_f0 * (long)dVar46 * (long)dVar47 * 8 +
                 (long)dVar47 * (long)local_f8 * 8 + (long)local_100 * 8)) * dVar59;
          auVar61 = vfmadd213sd_fma(auVar63,auVar87,auVar111);
          *(long *)((long)dVar33 + (long)local_f0 * (long)dVar31 * (long)dVar32 * 8 +
                    (long)dVar32 * (long)local_f8 * 8 + (long)local_100 * 8) = auVar61._0_8_;
          auVar112._8_8_ = 0;
          auVar112._0_8_ =
               *(ulong *)((long)dVar45 + (long)local_f0 * (long)dVar43 * (long)dVar44 * 8 +
                          (long)dVar44 * (long)local_f8 * 8 + (long)local_100 * 8);
          auVar64._8_8_ = 0;
          auVar64._0_8_ =
               *(ulong *)((long)dVar33 + (long)local_f0 * (long)dVar31 * (long)dVar32 * 8 +
                          (long)dVar32 * (long)local_f8 * 8 + (long)local_100 * 8);
          auVar88._8_8_ = 0;
          auVar88._0_8_ =
               in_RDI[3] *
               *(double *)
                ((long)dVar57 + (long)local_f0 * (long)dVar55 * (long)dVar56 * 8 +
                 (long)dVar56 * (long)local_f8 * 8 + (long)local_100 * 8);
          auVar61 = vfmadd213sd_fma(auVar64,auVar88,auVar112);
          *(long *)((long)dVar45 + (long)local_f0 * (long)dVar43 * (long)dVar44 * 8 +
                    (long)dVar44 * (long)local_f8 * 8 + (long)local_100 * 8) = auVar61._0_8_;
        }
      }
    }
  }
  if (((ulong)in_RDI[0x2d] & 4) != 0) {
    for (local_108 = 0.0; (ulong)local_108 < (ulong)in_RDI[0x31];
        local_108 = (double)((long)local_108 + 1)) {
      for (local_110 = 0.0; (ulong)local_110 < (ulong)in_RDI[0x2a];
          local_110 = (double)((long)local_110 + 1)) {
        for (local_118 = 0.0; (ulong)local_118 < (ulong)in_RDI[0x33];
            local_118 = (double)((long)local_118 + 1)) {
          auVar89._8_8_ = 0;
          auVar89._0_8_ = *(ulong *)((long)in_RDI[0x25] + (long)local_110 * 8);
          auVar65._8_8_ = 0;
          auVar65._0_8_ =
               *(ulong *)((long)dVar6 + (long)local_108 * (long)dVar4 * (long)dVar5 * 8 +
                          (long)dVar5 * (long)local_110 * 8 + (long)local_118 * 8);
          auVar113._8_8_ = 0;
          auVar113._0_8_ =
               *(double *)((long)in_RDI[0x28] + (long)local_110 * 8) *
               (*(double *)
                 ((long)dVar54 + (long)local_108 * (long)dVar52 * (long)dVar53 * 8 +
                  (((long)in_RDI[0x32] + -1) - (long)local_110) * (long)dVar53 * 8 +
                 (long)local_118 * 8) -
               *(double *)
                ((long)dVar54 + (long)local_108 * (long)dVar52 * (long)dVar53 * 8 +
                 (((long)in_RDI[0x32] + -2) - (long)local_110) * (long)dVar53 * 8 +
                (long)local_118 * 8)) * dVar59;
          auVar61 = vfmadd213sd_fma(auVar65,auVar89,auVar113);
          *(long *)((long)dVar6 + (long)local_108 * (long)dVar4 * (long)dVar5 * 8 +
                    (long)dVar5 * (long)local_110 * 8 + (long)local_118 * 8) = auVar61._0_8_;
          auVar114._8_8_ = 0;
          auVar114._0_8_ =
               *(ulong *)((long)dVar39 + (long)local_108 * (long)dVar37 * (long)dVar38 * 8 +
                          (((long)in_RDI[0x32] + -2) - (long)local_110) * (long)dVar38 * 8 +
                         (long)local_118 * 8);
          auVar66._8_8_ = 0;
          auVar66._0_8_ =
               *(ulong *)((long)dVar6 + (long)local_108 * (long)dVar4 * (long)dVar5 * 8 +
                          (long)dVar5 * (long)local_110 * 8 + (long)local_118 * 8);
          auVar90._8_8_ = 0;
          auVar90._0_8_ =
               -(in_RDI[3] *
                *(double *)
                 ((long)dVar57 + (long)local_108 * (long)dVar55 * (long)dVar56 * 8 +
                  (((long)in_RDI[0x32] + -2) - (long)local_110) * (long)dVar56 * 8 +
                 (long)local_118 * 8));
          auVar61 = vfmadd213sd_fma(auVar66,auVar90,auVar114);
          *(long *)((long)dVar39 + (long)local_108 * (long)dVar37 * (long)dVar38 * 8 +
                    (((long)in_RDI[0x32] + -2) - (long)local_110) * (long)dVar38 * 8 +
                   (long)local_118 * 8) = auVar61._0_8_;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = *(ulong *)((long)in_RDI[0x25] + (long)local_110 * 8);
          auVar67._8_8_ = 0;
          auVar67._0_8_ =
               *(ulong *)((long)dVar36 + (long)local_108 * (long)dVar34 * (long)dVar35 * 8 +
                          (long)dVar35 * (long)local_110 * 8 + (long)local_118 * 8);
          auVar115._8_8_ = 0;
          auVar115._0_8_ =
               *(double *)((long)in_RDI[0x28] + (long)local_110 * 8) *
               (*(double *)
                 ((long)dVar48 + (long)local_108 * (long)dVar46 * (long)dVar47 * 8 +
                  (((long)in_RDI[0x32] + -1) - (long)local_110) * (long)dVar47 * 8 +
                 (long)local_118 * 8) -
               *(double *)
                ((long)dVar48 + (long)local_108 * (long)dVar46 * (long)dVar47 * 8 +
                 (((long)in_RDI[0x32] + -2) - (long)local_110) * (long)dVar47 * 8 +
                (long)local_118 * 8)) * dVar59;
          auVar61 = vfmadd213sd_fma(auVar67,auVar91,auVar115);
          *(long *)((long)dVar36 + (long)local_108 * (long)dVar34 * (long)dVar35 * 8 +
                    (long)dVar35 * (long)local_110 * 8 + (long)local_118 * 8) = auVar61._0_8_;
          auVar116._8_8_ = 0;
          auVar116._0_8_ =
               *(ulong *)((long)dVar45 + (long)local_108 * (long)dVar43 * (long)dVar44 * 8 +
                          (((long)in_RDI[0x32] + -2) - (long)local_110) * (long)dVar44 * 8 +
                         (long)local_118 * 8);
          auVar68._8_8_ = 0;
          auVar68._0_8_ =
               *(ulong *)((long)dVar36 + (long)local_108 * (long)dVar34 * (long)dVar35 * 8 +
                          (long)dVar35 * (long)local_110 * 8 + (long)local_118 * 8);
          auVar92._8_8_ = 0;
          auVar92._0_8_ =
               in_RDI[3] *
               *(double *)
                ((long)dVar57 + (long)local_108 * (long)dVar55 * (long)dVar56 * 8 +
                 (((long)in_RDI[0x32] + -2) - (long)local_110) * (long)dVar56 * 8 +
                (long)local_118 * 8);
          auVar61 = vfmadd213sd_fma(auVar68,auVar92,auVar116);
          *(long *)((long)dVar45 + (long)local_108 * (long)dVar43 * (long)dVar44 * 8 +
                    (((long)in_RDI[0x32] + -2) - (long)local_110) * (long)dVar44 * 8 +
                   (long)local_118 * 8) = auVar61._0_8_;
        }
      }
    }
  }
  if (((ulong)in_RDI[0x2b] & 4) != 0) {
    for (local_120 = 0.0; (ulong)local_120 < (ulong)in_RDI[0x31];
        local_120 = (double)((long)local_120 + 1)) {
      for (local_128 = 0.0; (ulong)local_128 < (ulong)in_RDI[0x32];
          local_128 = (double)((long)local_128 + 1)) {
        for (local_130 = 0.0; (ulong)local_130 < (ulong)in_RDI[0x2a];
            local_130 = (double)((long)local_130 + 1)) {
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)((long)in_RDI[0x26] + (long)local_130 * 8);
          auVar69._8_8_ = 0;
          auVar69._0_8_ =
               *(ulong *)((long)dVar9 + (long)local_120 * (long)dVar7 * (long)dVar8 * 8 +
                          (long)dVar8 * (long)local_128 * 8 + (long)local_130 * 8);
          auVar117._8_8_ = 0;
          auVar117._0_8_ =
               *(double *)((long)in_RDI[0x29] + (long)local_130 * 8) *
               (*(double *)
                 ((long)dVar51 + (long)local_120 * (long)dVar49 * (long)dVar50 * 8 +
                  (long)dVar50 * (long)local_128 * 8 + 8 + (long)local_130 * 8) -
               *(double *)
                ((long)dVar51 + (long)local_120 * (long)dVar49 * (long)dVar50 * 8 +
                 (long)dVar50 * (long)local_128 * 8 + (long)local_130 * 8)) * dVar60;
          auVar61 = vfmadd213sd_fma(auVar69,auVar93,auVar117);
          *(long *)((long)dVar9 + (long)local_120 * (long)dVar7 * (long)dVar8 * 8 +
                    (long)dVar8 * (long)local_128 * 8 + (long)local_130 * 8) = auVar61._0_8_;
          auVar118._8_8_ = 0;
          auVar118._0_8_ =
               *(ulong *)((long)dVar39 + (long)local_120 * (long)dVar37 * (long)dVar38 * 8 +
                          (long)dVar38 * (long)local_128 * 8 + (long)local_130 * 8);
          auVar70._8_8_ = 0;
          auVar70._0_8_ =
               *(ulong *)((long)dVar9 + (long)local_120 * (long)dVar7 * (long)dVar8 * 8 +
                          (long)dVar8 * (long)local_128 * 8 + (long)local_130 * 8);
          auVar94._8_8_ = 0;
          auVar94._0_8_ =
               in_RDI[3] *
               *(double *)
                ((long)dVar57 + (long)local_120 * (long)dVar55 * (long)dVar56 * 8 +
                 (long)dVar56 * (long)local_128 * 8 + (long)local_130 * 8);
          auVar61 = vfmadd213sd_fma(auVar70,auVar94,auVar118);
          *(long *)((long)dVar39 + (long)local_120 * (long)dVar37 * (long)dVar38 * 8 +
                    (long)dVar38 * (long)local_128 * 8 + (long)local_130 * 8) = auVar61._0_8_;
          auVar95._8_8_ = 0;
          auVar95._0_8_ = *(ulong *)((long)in_RDI[0x26] + (long)local_130 * 8);
          auVar71._8_8_ = 0;
          auVar71._0_8_ =
               *(ulong *)((long)dVar21 + (long)local_120 * (long)dVar19 * (long)dVar20 * 8 +
                          (long)dVar20 * (long)local_128 * 8 + (long)local_130 * 8);
          auVar119._8_8_ = 0;
          auVar119._0_8_ =
               *(double *)((long)in_RDI[0x29] + (long)local_130 * 8) *
               (*(double *)
                 ((long)dVar48 + (long)local_120 * (long)dVar46 * (long)dVar47 * 8 +
                  (long)dVar47 * (long)local_128 * 8 + 8 + (long)local_130 * 8) -
               *(double *)
                ((long)dVar48 + (long)local_120 * (long)dVar46 * (long)dVar47 * 8 +
                 (long)dVar47 * (long)local_128 * 8 + (long)local_130 * 8)) * dVar60;
          auVar61 = vfmadd213sd_fma(auVar71,auVar95,auVar119);
          *(long *)((long)dVar21 + (long)local_120 * (long)dVar19 * (long)dVar20 * 8 +
                    (long)dVar20 * (long)local_128 * 8 + (long)local_130 * 8) = auVar61._0_8_;
          auVar120._8_8_ = 0;
          auVar120._0_8_ =
               *(ulong *)((long)dVar42 + (long)local_120 * (long)dVar40 * (long)dVar41 * 8 +
                          (long)dVar41 * (long)local_128 * 8 + (long)local_130 * 8);
          auVar72._8_8_ = 0;
          auVar72._0_8_ =
               *(ulong *)((long)dVar21 + (long)local_120 * (long)dVar19 * (long)dVar20 * 8 +
                          (long)dVar20 * (long)local_128 * 8 + (long)local_130 * 8);
          auVar96._8_8_ = 0;
          auVar96._0_8_ =
               -(in_RDI[3] *
                *(double *)
                 ((long)dVar57 + (long)local_120 * (long)dVar55 * (long)dVar56 * 8 +
                  (long)dVar56 * (long)local_128 * 8 + (long)local_130 * 8));
          auVar61 = vfmadd213sd_fma(auVar72,auVar96,auVar120);
          *(long *)((long)dVar42 + (long)local_120 * (long)dVar40 * (long)dVar41 * 8 +
                    (long)dVar41 * (long)local_128 * 8 + (long)local_130 * 8) = auVar61._0_8_;
        }
      }
    }
  }
  if ((*(uint *)((long)in_RDI + 0x15c) & 4) != 0) {
    for (local_138 = 0.0; (ulong)local_138 < (ulong)in_RDI[0x31];
        local_138 = (double)((long)local_138 + 1)) {
      for (local_140 = 0.0; (ulong)local_140 < (ulong)in_RDI[0x32];
          local_140 = (double)((long)local_140 + 1)) {
        for (local_148 = 0.0; (ulong)local_148 < (ulong)in_RDI[0x2a];
            local_148 = (double)((long)local_148 + 1)) {
          auVar97._8_8_ = 0;
          auVar97._0_8_ = *(ulong *)((long)in_RDI[0x26] + (long)local_148 * 8);
          auVar73._8_8_ = 0;
          auVar73._0_8_ =
               *(ulong *)((long)dVar12 + (long)local_138 * (long)dVar10 * (long)dVar11 * 8 +
                          (long)dVar11 * (long)local_140 * 8 + (long)local_148 * 8);
          auVar121._8_8_ = 0;
          auVar121._0_8_ =
               *(double *)((long)in_RDI[0x29] + (long)local_148 * 8) *
               (*(double *)
                 ((long)dVar51 + (long)local_138 * (long)dVar49 * (long)dVar50 * 8 +
                  (long)dVar50 * (long)local_140 * 8 +
                 (((long)in_RDI[0x33] + -1) - (long)local_148) * 8) -
               *(double *)
                ((long)dVar51 + (long)local_138 * (long)dVar49 * (long)dVar50 * 8 +
                 (long)dVar50 * (long)local_140 * 8 +
                (((long)in_RDI[0x33] + -2) - (long)local_148) * 8)) * dVar60;
          auVar61 = vfmadd213sd_fma(auVar73,auVar97,auVar121);
          *(long *)((long)dVar12 + (long)local_138 * (long)dVar10 * (long)dVar11 * 8 +
                    (long)dVar11 * (long)local_140 * 8 + (long)local_148 * 8) = auVar61._0_8_;
          auVar122._8_8_ = 0;
          auVar122._0_8_ =
               *(ulong *)((long)dVar39 + (long)local_138 * (long)dVar37 * (long)dVar38 * 8 +
                          (long)dVar38 * (long)local_140 * 8 +
                         (((long)in_RDI[0x33] + -2) - (long)local_148) * 8);
          auVar74._8_8_ = 0;
          auVar74._0_8_ =
               *(ulong *)((long)dVar12 + (long)local_138 * (long)dVar10 * (long)dVar11 * 8 +
                          (long)dVar11 * (long)local_140 * 8 + (long)local_148 * 8);
          auVar98._8_8_ = 0;
          auVar98._0_8_ =
               in_RDI[3] *
               *(double *)
                ((long)dVar57 + (long)local_138 * (long)dVar55 * (long)dVar56 * 8 +
                 (long)dVar56 * (long)local_140 * 8 +
                (((long)in_RDI[0x33] + -2) - (long)local_148) * 8);
          auVar61 = vfmadd213sd_fma(auVar74,auVar98,auVar122);
          *(long *)((long)dVar39 + (long)local_138 * (long)dVar37 * (long)dVar38 * 8 +
                    (long)dVar38 * (long)local_140 * 8 +
                   (((long)in_RDI[0x33] + -2) - (long)local_148) * 8) = auVar61._0_8_;
          auVar99._8_8_ = 0;
          auVar99._0_8_ = *(ulong *)((long)in_RDI[0x26] + (long)local_148 * 8);
          auVar75._8_8_ = 0;
          auVar75._0_8_ =
               *(ulong *)((long)dVar24 + (long)local_138 * (long)dVar22 * (long)dVar23 * 8 +
                          (long)dVar23 * (long)local_140 * 8 + (long)local_148 * 8);
          auVar123._8_8_ = 0;
          auVar123._0_8_ =
               *(double *)((long)in_RDI[0x29] + (long)local_148 * 8) *
               (*(double *)
                 ((long)dVar48 + (long)local_138 * (long)dVar46 * (long)dVar47 * 8 +
                  (long)dVar47 * (long)local_140 * 8 +
                 (((long)in_RDI[0x33] + -1) - (long)local_148) * 8) -
               *(double *)
                ((long)dVar48 + (long)local_138 * (long)dVar46 * (long)dVar47 * 8 +
                 (long)dVar47 * (long)local_140 * 8 +
                (((long)in_RDI[0x33] + -2) - (long)local_148) * 8)) * dVar60;
          auVar61 = vfmadd213sd_fma(auVar75,auVar99,auVar123);
          *(long *)((long)dVar24 + (long)local_138 * (long)dVar22 * (long)dVar23 * 8 +
                    (long)dVar23 * (long)local_140 * 8 + (long)local_148 * 8) = auVar61._0_8_;
          auVar124._8_8_ = 0;
          auVar124._0_8_ =
               *(ulong *)((long)dVar42 + (long)local_138 * (long)dVar40 * (long)dVar41 * 8 +
                          (long)dVar41 * (long)local_140 * 8 +
                         (((long)in_RDI[0x33] + -2) - (long)local_148) * 8);
          auVar76._8_8_ = 0;
          auVar76._0_8_ =
               *(ulong *)((long)dVar24 + (long)local_138 * (long)dVar22 * (long)dVar23 * 8 +
                          (long)dVar23 * (long)local_140 * 8 + (long)local_148 * 8);
          auVar100._8_8_ = 0;
          auVar100._0_8_ =
               -(in_RDI[3] *
                *(double *)
                 ((long)dVar57 + (long)local_138 * (long)dVar55 * (long)dVar56 * 8 +
                  (long)dVar56 * (long)local_140 * 8 +
                 (((long)in_RDI[0x33] + -2) - (long)local_148) * 8));
          auVar61 = vfmadd213sd_fma(auVar76,auVar100,auVar124);
          *(long *)((long)dVar42 + (long)local_138 * (long)dVar40 * (long)dVar41 * 8 +
                    (long)dVar41 * (long)local_140 * 8 +
                   (((long)in_RDI[0x33] + -2) - (long)local_148) * 8) = auVar61._0_8_;
        }
      }
    }
  }
  if ((*(uint *)((long)in_RDI + 0x164) & 4) != 0) {
    for (local_150 = 0.0; (ulong)local_150 < (ulong)in_RDI[0x2a];
        local_150 = (double)((long)local_150 + 1)) {
      for (local_158 = 0.0; (ulong)local_158 < (ulong)in_RDI[0x32];
          local_158 = (double)((long)local_158 + 1)) {
        for (local_160 = 0.0; (ulong)local_160 < (ulong)in_RDI[0x33];
            local_160 = (double)((long)local_160 + 1)) {
          auVar101._8_8_ = 0;
          auVar101._0_8_ = *(ulong *)((long)in_RDI[0x24] + (long)local_150 * 8);
          auVar77._8_8_ = 0;
          auVar77._0_8_ =
               *(ulong *)((long)dVar15 + (long)local_150 * (long)dVar13 * (long)dVar14 * 8 +
                          (long)dVar14 * (long)local_158 * 8 + (long)local_160 * 8);
          auVar125._8_8_ = 0;
          auVar125._0_8_ =
               *(double *)((long)in_RDI[0x27] + (long)local_150 * 8) *
               (*(double *)
                 ((long)dVar54 + ((long)local_150 + 1) * (long)dVar52 * (long)dVar53 * 8 +
                  (long)dVar53 * (long)local_158 * 8 + (long)local_160 * 8) -
               *(double *)
                ((long)dVar54 + (long)local_150 * (long)dVar52 * (long)dVar53 * 8 +
                 (long)dVar53 * (long)local_158 * 8 + (long)local_160 * 8)) * dVar58;
          auVar61 = vfmadd213sd_fma(auVar77,auVar101,auVar125);
          *(long *)((long)dVar15 + (long)local_150 * (long)dVar13 * (long)dVar14 * 8 +
                    (long)dVar14 * (long)local_158 * 8 + (long)local_160 * 8) = auVar61._0_8_;
          auVar126._8_8_ = 0;
          auVar126._0_8_ =
               *(ulong *)((long)dVar42 + (long)local_150 * (long)dVar40 * (long)dVar41 * 8 +
                          (long)dVar41 * (long)local_158 * 8 + (long)local_160 * 8);
          auVar78._8_8_ = 0;
          auVar78._0_8_ =
               *(ulong *)((long)dVar15 + (long)local_150 * (long)dVar13 * (long)dVar14 * 8 +
                          (long)dVar14 * (long)local_158 * 8 + (long)local_160 * 8);
          auVar102._8_8_ = 0;
          auVar102._0_8_ =
               in_RDI[3] *
               *(double *)
                ((long)dVar57 + (long)local_150 * (long)dVar55 * (long)dVar56 * 8 +
                 (long)dVar56 * (long)local_158 * 8 + (long)local_160 * 8);
          auVar61 = vfmadd213sd_fma(auVar78,auVar102,auVar126);
          *(long *)((long)dVar42 + (long)local_150 * (long)dVar40 * (long)dVar41 * 8 +
                    (long)dVar41 * (long)local_158 * 8 + (long)local_160 * 8) = auVar61._0_8_;
          auVar103._8_8_ = 0;
          auVar103._0_8_ = *(ulong *)((long)in_RDI[0x24] + (long)local_150 * 8);
          auVar79._8_8_ = 0;
          auVar79._0_8_ =
               *(ulong *)((long)dVar27 + (long)local_150 * (long)dVar25 * (long)dVar26 * 8 +
                          (long)dVar26 * (long)local_158 * 8 + (long)local_160 * 8);
          auVar127._8_8_ = 0;
          auVar127._0_8_ =
               *(double *)((long)in_RDI[0x27] + (long)local_150 * 8) *
               (*(double *)
                 ((long)dVar51 + ((long)local_150 + 1) * (long)dVar49 * (long)dVar50 * 8 +
                  (long)dVar50 * (long)local_158 * 8 + (long)local_160 * 8) -
               *(double *)
                ((long)dVar51 + (long)local_150 * (long)dVar49 * (long)dVar50 * 8 +
                 (long)dVar50 * (long)local_158 * 8 + (long)local_160 * 8)) * dVar58;
          auVar61 = vfmadd213sd_fma(auVar79,auVar103,auVar127);
          *(long *)((long)dVar27 + (long)local_150 * (long)dVar25 * (long)dVar26 * 8 +
                    (long)dVar26 * (long)local_158 * 8 + (long)local_160 * 8) = auVar61._0_8_;
          auVar128._8_8_ = 0;
          auVar128._0_8_ =
               *(ulong *)((long)dVar45 + (long)local_150 * (long)dVar43 * (long)dVar44 * 8 +
                          (long)dVar44 * (long)local_158 * 8 + (long)local_160 * 8);
          auVar80._8_8_ = 0;
          auVar80._0_8_ =
               *(ulong *)((long)dVar27 + (long)local_150 * (long)dVar25 * (long)dVar26 * 8 +
                          (long)dVar26 * (long)local_158 * 8 + (long)local_160 * 8);
          auVar104._8_8_ = 0;
          auVar104._0_8_ =
               -(in_RDI[3] *
                *(double *)
                 ((long)dVar57 + (long)local_150 * (long)dVar55 * (long)dVar56 * 8 +
                  (long)dVar56 * (long)local_158 * 8 + (long)local_160 * 8));
          auVar61 = vfmadd213sd_fma(auVar80,auVar104,auVar128);
          *(long *)((long)dVar45 + (long)local_150 * (long)dVar43 * (long)dVar44 * 8 +
                    (long)dVar44 * (long)local_158 * 8 + (long)local_160 * 8) = auVar61._0_8_;
        }
      }
    }
  }
  if (((ulong)in_RDI[0x2c] & 4) != 0) {
    for (local_168 = 0.0; (ulong)local_168 < (ulong)in_RDI[0x2a];
        local_168 = (double)((long)local_168 + 1)) {
      for (local_170 = 0.0; (ulong)local_170 < (ulong)in_RDI[0x32];
          local_170 = (double)((long)local_170 + 1)) {
        for (local_178 = 0.0; (ulong)local_178 < (ulong)in_RDI[0x33];
            local_178 = (double)((long)local_178 + 1)) {
          auVar105._8_8_ = 0;
          auVar105._0_8_ = *(ulong *)((long)in_RDI[0x24] + (long)local_168 * 8);
          auVar81._8_8_ = 0;
          auVar81._0_8_ =
               *(ulong *)((long)dVar18 + (long)local_168 * (long)dVar16 * (long)dVar17 * 8 +
                          (long)dVar17 * (long)local_170 * 8 + (long)local_178 * 8);
          auVar129._8_8_ = 0;
          auVar129._0_8_ =
               *(double *)((long)in_RDI[0x27] + (long)local_168 * 8) *
               (*(double *)
                 ((long)dVar54 +
                  (((long)in_RDI[0x31] + -1) - (long)local_168) * (long)dVar52 * (long)dVar53 * 8 +
                  (long)dVar53 * (long)local_170 * 8 + (long)local_178 * 8) -
               *(double *)
                ((long)dVar54 +
                 (((long)in_RDI[0x31] + -2) - (long)local_168) * (long)dVar52 * (long)dVar53 * 8 +
                 (long)dVar53 * (long)local_170 * 8 + (long)local_178 * 8)) * dVar58;
          auVar61 = vfmadd213sd_fma(auVar81,auVar105,auVar129);
          *(long *)((long)dVar18 + (long)local_168 * (long)dVar16 * (long)dVar17 * 8 +
                    (long)dVar17 * (long)local_170 * 8 + (long)local_178 * 8) = auVar61._0_8_;
          auVar130._8_8_ = 0;
          auVar130._0_8_ =
               *(ulong *)((long)dVar42 +
                          (((long)in_RDI[0x31] + -2) - (long)local_168) *
                          (long)dVar40 * (long)dVar41 * 8 + (long)dVar41 * (long)local_170 * 8 +
                         (long)local_178 * 8);
          auVar82._8_8_ = 0;
          auVar82._0_8_ =
               *(ulong *)((long)dVar18 + (long)local_168 * (long)dVar16 * (long)dVar17 * 8 +
                          (long)dVar17 * (long)local_170 * 8 + (long)local_178 * 8);
          auVar106._8_8_ = 0;
          auVar106._0_8_ =
               in_RDI[3] *
               *(double *)
                ((long)dVar57 +
                 (((long)in_RDI[0x31] + -2) - (long)local_168) * (long)dVar55 * (long)dVar56 * 8 +
                 (long)dVar56 * (long)local_170 * 8 + (long)local_178 * 8);
          auVar61 = vfmadd213sd_fma(auVar82,auVar106,auVar130);
          *(long *)((long)dVar42 +
                    (((long)in_RDI[0x31] + -2) - (long)local_168) * (long)dVar40 * (long)dVar41 * 8
                    + (long)dVar41 * (long)local_170 * 8 + (long)local_178 * 8) = auVar61._0_8_;
          auVar107._8_8_ = 0;
          auVar107._0_8_ = *(ulong *)((long)in_RDI[0x24] + (long)local_168 * 8);
          auVar83._8_8_ = 0;
          auVar83._0_8_ =
               *(ulong *)((long)dVar30 + (long)local_168 * (long)dVar28 * (long)dVar29 * 8 +
                          (long)dVar29 * (long)local_170 * 8 + (long)local_178 * 8);
          auVar131._8_8_ = 0;
          auVar131._0_8_ =
               *(double *)((long)in_RDI[0x27] + (long)local_168 * 8) *
               (*(double *)
                 ((long)dVar51 +
                  (((long)in_RDI[0x31] + -1) - (long)local_168) * (long)dVar49 * (long)dVar50 * 8 +
                  (long)dVar50 * (long)local_170 * 8 + (long)local_178 * 8) -
               *(double *)
                ((long)dVar51 +
                 (((long)in_RDI[0x31] + -2) - (long)local_168) * (long)dVar49 * (long)dVar50 * 8 +
                 (long)dVar50 * (long)local_170 * 8 + (long)local_178 * 8)) * dVar58;
          auVar61 = vfmadd213sd_fma(auVar83,auVar107,auVar131);
          *(long *)((long)dVar30 + (long)local_168 * (long)dVar28 * (long)dVar29 * 8 +
                    (long)dVar29 * (long)local_170 * 8 + (long)local_178 * 8) = auVar61._0_8_;
          auVar132._8_8_ = 0;
          auVar132._0_8_ =
               *(ulong *)((long)dVar45 +
                          (((long)in_RDI[0x31] + -2) - (long)local_168) *
                          (long)dVar43 * (long)dVar44 * 8 + (long)dVar44 * (long)local_170 * 8 +
                         (long)local_178 * 8);
          auVar84._8_8_ = 0;
          auVar84._0_8_ =
               *(ulong *)((long)dVar30 + (long)local_168 * (long)dVar28 * (long)dVar29 * 8 +
                          (long)dVar29 * (long)local_170 * 8 + (long)local_178 * 8);
          auVar108._8_8_ = 0;
          auVar108._0_8_ =
               -(in_RDI[3] *
                *(double *)
                 ((long)dVar57 +
                  (((long)in_RDI[0x31] + -2) - (long)local_168) * (long)dVar55 * (long)dVar56 * 8 +
                  (long)dVar56 * (long)local_170 * 8 + (long)local_178 * 8));
          auVar61 = vfmadd213sd_fma(auVar84,auVar108,auVar132);
          *(long *)((long)dVar45 +
                    (((long)in_RDI[0x31] + -2) - (long)local_168) * (long)dVar43 * (long)dVar44 * 8
                    + (long)dVar44 * (long)local_170 * 8 + (long)local_178 * 8) = auVar61._0_8_;
        }
      }
    }
  }
  return;
}

Assistant:

static void update_magnetic_cpml(struct fdtd3D *fdtd) {
  // Hx
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->cpml_thickness, fdtd->sizeZ,
                    psi_hx_left, fdtd->psi_hx_y[0]);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->cpml_thickness, fdtd->sizeZ,
                    psi_hx_right, fdtd->psi_hx_y[1]);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->cpml_thickness,
                    psi_hx_front, fdtd->psi_hx_z[0]);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->cpml_thickness,
                    psi_hx_back, fdtd->psi_hx_z[1]);
  // Hy
  VLA_3D_definition(float_type, fdtd->cpml_thickness, fdtd->sizeY, fdtd->sizeZ,
                    psi_hy_bottom, fdtd->psi_hy_x[0]);
  VLA_3D_definition(float_type, fdtd->cpml_thickness, fdtd->sizeY, fdtd->sizeZ,
                    psi_hy_top, fdtd->psi_hy_x[1]);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->cpml_thickness,
                    psi_hy_front, fdtd->psi_hy_z[0]);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->cpml_thickness,
                    psi_hy_back, fdtd->psi_hy_z[1]);

  // Hz
  VLA_3D_definition(float_type, fdtd->cpml_thickness, fdtd->sizeY, fdtd->sizeZ,
                    psi_hz_bottom, fdtd->psi_hz_x[0]);
  VLA_3D_definition(float_type, fdtd->cpml_thickness, fdtd->sizeY, fdtd->sizeZ,
                    psi_hz_top, fdtd->psi_hz_x[1]);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->cpml_thickness, fdtd->sizeZ,
                    psi_hz_left, fdtd->psi_hz_y[0]);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->cpml_thickness, fdtd->sizeZ,
                    psi_hz_right, fdtd->psi_hz_y[1]);
  // Sim data
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, hx,
                    fdtd->hx);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, hy,
                    fdtd->hy);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, hz,
                    fdtd->hz);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, ex,
                    fdtd->ex);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, ey,
                    fdtd->ey);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ, ez,
                    fdtd->ez);
  VLA_3D_definition(float_type, fdtd->sizeX, fdtd->sizeY, fdtd->sizeZ,
                    permeability_inv, fdtd->permeability_inv);
  // Useful constants
  float_type _dx = float_cst(1.) / fdtd->dx;
  float_type _dy = float_cst(1.) / fdtd->dy;
  float_type _dz = float_cst(1.) / fdtd->dz;

  if (fdtd->border_condition[border_left] & border_cpml) { // hx_y & hz_y
    for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
      for (uintmax_t j = 0; j < fdtd->cpml_thickness; ++j) {
        for (uintmax_t k = 0; k < fdtd->sizeZ; ++k) {
          psi_hx_left[i][j][k] =
              fdtd->by[j] * psi_hx_left[i][j][k] +
              fdtd->cy[j] * (ez[i][j + 1][k] - ez[i][j][k]) * _dy;
          hx[i][j][k] = hx[i][j][k] - fdtd->dt * permeability_inv[i][j][k] *
                                          psi_hx_left[i][j][k];
          psi_hz_left[i][j][k] =
              fdtd->by[j] * psi_hz_left[i][j][k] +
              fdtd->cy[j] * (ex[i][j + 1][k] - ex[i][j][k]) * _dy;
          hz[i][j][k] = hz[i][j][k] + fdtd->dt * permeability_inv[i][j][k] *
                                          psi_hz_left[i][j][k];
        }
      }
    }
  }
  if (fdtd->border_condition[border_right] & border_cpml) { // hx_y & hz_y
    for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
      for (uintmax_t j = 0; j < fdtd->cpml_thickness; ++j) {
        for (uintmax_t k = 0; k < fdtd->sizeZ; ++k) {
          psi_hx_right[i][j][k] = fdtd->by[j] * psi_hx_right[i][j][k] +
                                  fdtd->cy[j] *
                                      (ez[i][fdtd->sizeY - 1 - j][k] -
                                       ez[i][fdtd->sizeY - 2 - j][k]) *
                                      _dy;
          hx[i][fdtd->sizeY - 2 - j][k] =
              hx[i][fdtd->sizeY - 2 - j][k] -
              fdtd->dt * permeability_inv[i][fdtd->sizeY - 2 - j][k] *
                  psi_hx_right[i][j][k];
          psi_hz_right[i][j][k] = fdtd->by[j] * psi_hz_right[i][j][k] +
                                  fdtd->cy[j] *
                                      (ex[i][fdtd->sizeY - 1 - j][k] -
                                       ex[i][fdtd->sizeY - 2 - j][k]) *
                                      _dy;
          hz[i][fdtd->sizeY - 2 - j][k] =
              hz[i][fdtd->sizeY - 2 - j][k] +
              fdtd->dt * permeability_inv[i][fdtd->sizeY - 2 - j][k] *
                  psi_hz_right[i][j][k];
        }
      }
    }
  }
  if (fdtd->border_condition[border_front] & border_cpml) { // hx_z & hy_z
    for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
      for (uintmax_t j = 0; j < fdtd->sizeY; ++j) {
        for (uintmax_t k = 0; k < fdtd->cpml_thickness; ++k) {
          psi_hx_front[i][j][k] =
              fdtd->bz[k] * psi_hx_front[i][j][k] +
              fdtd->cz[k] * (ey[i][j][k + 1] - ey[i][j][k]) * _dz;
          hx[i][j][k] = hx[i][j][k] + fdtd->dt * permeability_inv[i][j][k] *
                                          psi_hx_front[i][j][k];
          psi_hy_front[i][j][k] =
              fdtd->bz[k] * psi_hy_front[i][j][k] +
              fdtd->cz[k] * (ex[i][j][k + 1] - ex[i][j][k]) * _dz;
          hy[i][j][k] = hy[i][j][k] - fdtd->dt * permeability_inv[i][j][k] *
                                          psi_hy_front[i][j][k];
        }
      }
    }
  }
  if (fdtd->border_condition[border_back] & border_cpml) { // hx_z & hy_z
    for (uintmax_t i = 0; i < fdtd->sizeX; ++i) {
      for (uintmax_t j = 0; j < fdtd->sizeY; ++j) {
        for (uintmax_t k = 0; k < fdtd->cpml_thickness; ++k) {
          psi_hx_back[i][j][k] = fdtd->bz[k] * psi_hx_back[i][j][k] +
                                 fdtd->cz[k] *
                                     (ey[i][j][fdtd->sizeZ - 1 - k] -
                                      ey[i][j][fdtd->sizeZ - 2 - k]) *
                                     _dz;
          hx[i][j][fdtd->sizeZ - 2 - k] =
              hx[i][j][fdtd->sizeZ - 2 - k] +
              fdtd->dt * permeability_inv[i][j][fdtd->sizeZ - 2 - k] *
                  psi_hx_back[i][j][k];
          psi_hy_back[i][j][k] = fdtd->bz[k] * psi_hy_back[i][j][k] +
                                 fdtd->cz[k] *
                                     (ex[i][j][fdtd->sizeZ - 1 - k] -
                                      ex[i][j][fdtd->sizeZ - 2 - k]) *
                                     _dz;
          hy[i][j][fdtd->sizeZ - 2 - k] =
              hy[i][j][fdtd->sizeZ - 2 - k] -
              fdtd->dt * permeability_inv[i][j][fdtd->sizeZ - 2 - k] *
                  psi_hy_back[i][j][k];
        }
      }
    }
  }
  if (fdtd->border_condition[border_bottom] & border_cpml) { // hy_x & hz_x
    for (uintmax_t i = 0; i < fdtd->cpml_thickness; ++i) {
      for (uintmax_t j = 0; j < fdtd->sizeY; ++j) {
        for (uintmax_t k = 0; k < fdtd->sizeZ; ++k) {
          psi_hy_bottom[i][j][k] =
              fdtd->bx[i] * psi_hy_bottom[i][j][k] +
              fdtd->cx[i] * (ez[i + 1][j][k] - ez[i][j][k]) * _dx;
          hy[i][j][k] = hy[i][j][k] + fdtd->dt * permeability_inv[i][j][k] *
                                          psi_hy_bottom[i][j][k];
          psi_hz_bottom[i][j][k] =
              fdtd->bx[i] * psi_hz_bottom[i][j][k] +
              fdtd->cx[i] * (ey[i + 1][j][k] - ey[i][j][k]) * _dx;
          hz[i][j][k] = hz[i][j][k] - fdtd->dt * permeability_inv[i][j][k] *
                                          psi_hz_bottom[i][j][k];
        }
      }
    }
  }
  if (fdtd->border_condition[border_top] & border_cpml) { // hy_x & hz_x
    for (uintmax_t i = 0; i < fdtd->cpml_thickness; ++i) {
      for (uintmax_t j = 0; j < fdtd->sizeY; ++j) {
        for (uintmax_t k = 0; k < fdtd->sizeZ; ++k) {
          psi_hy_top[i][j][k] = fdtd->bx[i] * psi_hy_top[i][j][k] +
                                fdtd->cx[i] *
                                    (ez[fdtd->sizeX - 1 - i][j][k] -
                                     ez[fdtd->sizeX - 2 - i][j][k]) *
                                    _dx;
          hy[fdtd->sizeX - 2 - i][j][k] =
              hy[fdtd->sizeX - 2 - i][j][k] +
              fdtd->dt * permeability_inv[fdtd->sizeX - 2 - i][j][k] *
                  psi_hy_top[i][j][k];
          psi_hz_top[i][j][k] = fdtd->bx[i] * psi_hz_top[i][j][k] +
                                fdtd->cx[i] *
                                    (ey[fdtd->sizeX - 1 - i][j][k] -
                                     ey[fdtd->sizeX - 2 - i][j][k]) *
                                    _dx;
          hz[fdtd->sizeX - 2 - i][j][k] =
              hz[fdtd->sizeX - 2 - i][j][k] -
              fdtd->dt * permeability_inv[fdtd->sizeX - 2 - i][j][k] *
                  psi_hz_top[i][j][k];
        }
      }
    }
  }
}